

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Treap.h
# Opt level: O2

Node * __thiscall Treap<unsigned_long>::merge(Treap<unsigned_long> *this,Node *t1,Node *t2)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar1 = t1;
  if ((t2 != (Node *)0x0) && (pNVar1 = t2, t1 != (Node *)0x0)) {
    if (t2->p < t1->p) {
      pNVar1 = merge(this,t1->right,t2);
      t1->right = pNVar1;
      pNVar1 = t1;
    }
    else {
      pNVar2 = merge(this,t1,t2->left);
      t2->left = pNVar2;
    }
  }
  return pNVar1;
}

Assistant:

Node *merge(Node *t1, Node *t2) {
    if (!t2)
      return t1;

    if (!t1)
      return t2;

    if (t1->p > t2->p) {
      t1->right = merge(t1->right, t2);
      return t1;
    } else {
      t2->left = merge(t1, t2->left);
      return t2;
    }
  }